

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

Am_Value * __thiscall Am_Value::operator=(Am_Value *this,Am_Method_Wrapper *in_value)

{
  bool bVar1;
  int iVar2;
  Am_Method_Wrapper *in_value_local;
  Am_Value *this_local;
  
  bVar1 = Am_Type_Is_Ref_Counted(this->type);
  if ((bVar1) && ((this->value).wrapper_value != (Am_Wrapper *)0x0)) {
    Am_Wrapper::Release((this->value).wrapper_value);
  }
  if (in_value == (Am_Method_Wrapper *)0x0) {
    this->type = 0x3000;
  }
  else {
    iVar2 = (**(in_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
    this->type = (Am_Value_Type)iVar2;
  }
  (this->value).method_value = in_value;
  return this;
}

Assistant:

Am_Value &
Am_Value::operator=(Am_Method_Wrapper *in_value)
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  if (in_value)
    type = (Am_Value_Type)in_value->ID();
  else
    type = Am_METHOD_TYPE;
  value.method_value = in_value;
  return *this;
}